

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

void __thiscall pg::PPSolver::reportRegion(PPSolver *this,int p)

{
  int vertex;
  Game *pGVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  int *piVar7;
  uint uVar8;
  int *piVar9;
  _label_vertex local_50;
  uint local_3c;
  int *local_38;
  
  uVar8 = p & 1;
  poVar4 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,p);
  std::operator<<(poVar4,"\x1b[m");
  piVar7 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = this->regions[p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_3c = uVar8;
  do {
    if (piVar7 == local_38) {
      std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      return;
    }
    vertex = *piVar7;
    if (this->region[vertex] == p) {
      poVar4 = std::operator<<((this->super_Solver).logger," \x1b[37m");
      local_50.g = (this->super_Solver).game;
      local_50.v = vertex;
      poVar4 = operator<<(poVar4,&local_50);
      std::operator<<(poVar4,"\x1b[m");
    }
    uVar3 = Solver::owner(&this->super_Solver,vertex);
    if (uVar3 == uVar8) {
      uVar5 = (ulong)this->strategy[vertex];
      if (uVar5 == 0xffffffffffffffff) {
        if (((this->super_Solver).game)->_priority[vertex] != p) {
          poVar4 = (this->super_Solver).logger;
          pcVar6 = "\x1b[31;1m--\x1b[m";
          goto LAB_00149886;
        }
      }
      else if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
              (this->region[uVar5] == p)) {
        poVar4 = std::operator<<((this->super_Solver).logger,"->");
        local_50.g = (this->super_Solver).game;
        local_50.v = this->strategy[vertex];
        operator<<(poVar4,&local_50);
      }
      else {
        poVar4 = std::operator<<((this->super_Solver).logger,"->\x1b[31;1m");
        local_50.g = (this->super_Solver).game;
        local_50.v = this->strategy[vertex];
        poVar4 = operator<<(poVar4,&local_50);
        pcVar6 = "\x1b[m";
LAB_00149886:
        std::operator<<(poVar4,pcVar6);
      }
    }
    else {
      pGVar1 = (this->super_Solver).game;
      bVar2 = false;
      for (piVar9 = pGVar1->_outedges + pGVar1->_firstouts[vertex]; uVar5 = (ulong)*piVar9,
          uVar5 != 0xffffffffffffffff; piVar9 = piVar9 + 1) {
        if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
           (this->region[uVar5] != p && this->region[uVar5] != -2)) {
          pcVar6 = "(";
          if (bVar2) {
            pcVar6 = ",";
          }
          std::operator<<((this->super_Solver).logger,pcVar6);
          if (this->region[uVar5] < p) {
            poVar4 = (this->super_Solver).logger;
            if (((this->super_Solver).game)->_priority[vertex] == p) goto LAB_001497e3;
            pcVar6 = "\x1b[31;1mesc\x1b[m";
          }
          else {
            poVar4 = (this->super_Solver).logger;
LAB_001497e3:
            poVar4 = std::operator<<(poVar4,"\x1b[36m");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->region[uVar5]);
            pcVar6 = "\x1b[m";
          }
          std::operator<<(poVar4,pcVar6);
          bVar2 = true;
        }
      }
      uVar8 = local_3c;
      if (bVar2) {
        poVar4 = (this->super_Solver).logger;
        pcVar6 = ")";
        goto LAB_00149886;
      }
    }
    piVar7 = piVar7 + 1;
  } while( true );
}

Assistant:

void
PPSolver::reportRegion(int p)
{
    const int pl = p&1;
    logger << "\033[1;33mregion \033[36m" << p << "\033[m";
    for (int n : regions[p]) {
        if (region[n] == p) logger << " \033[37m" << label_vertex(n) << "\033[m";
        if (owner(n) == pl) {
            if (strategy[n] == -1) {
                if (priority(n) != p) logger << "\033[31;1m--\033[m";
            } else {
                if (disabled[strategy[n]] or region[strategy[n]] != p) logger << "->\033[31;1m" << label_vertex(strategy[n]) << "\033[m";
                else logger << "->" << label_vertex(strategy[n]);
            }
        } else {
            bool got = false;
            for (auto curedge = outs(n); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                if (region[to] == -2) continue;
                if (region[to] == p) continue;
                if (!got) logger << "(";
                else logger << ",";
                got = true;
                if (region[to] < p) {
                    if (priority(n) != p) logger << "\033[31;1mesc\033[m";
                    else logger << "\033[36m" << region[to] << "\033[m";
                } else logger << "\033[36m" << region[to] << "\033[m";
            }
            if (got) logger << ")";
        }
    }
    logger << std::endl;
}